

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_TxidEmpty_Test::TestBody(Txid_TxidEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8;
  Message local_c0;
  int local_b4;
  ByteData local_b0;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  Txid txid;
  Txid_TxidEmpty_Test *this_local;
  
  cfd::core::Txid::Txid((Txid *)&gtest_ar.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_60,(Txid *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ((internal *)local_40,"txid.GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  cfd::core::Txid::GetData(&local_b0,(Txid *)&gtest_ar.message_);
  local_98 = cfd::core::ByteData::GetDataSize(&local_b0);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_90,"txid.GetData().GetDataSize()","0",&local_98,&local_b4);
  cfd::core::ByteData::~ByteData(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Txid, TxidEmpty) {
  // cfd::core::CfdCoreHandle handle = nullptr;
  // cfd::core::Initialize(&handle);
  Txid txid;
  EXPECT_STREQ(txid.GetHex().c_str(), "");
  EXPECT_EQ(txid.GetData().GetDataSize(), 0);
}